

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<void>>
          (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>> *this,Canceler *params,
          Promise<void> *params_1)

{
  Own<kj::_::PromiseNode> local_28;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)this = &PTR_onReady_0067b220;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_0067b268;
  this[0x18] = (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>)0x0;
  this[0x178] = (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>)0x0;
  this[0x180] = (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>)0x1;
  local_28.disposer = (params_1->super_PromiseBase).node.disposer;
  local_28.ptr = (params_1->super_PromiseBase).node.ptr;
  (params_1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  Canceler::AdapterImpl<void>::AdapterImpl
            ((AdapterImpl<void> *)(this + 0x188),(PromiseFulfiller<void> *)(this + 0x10),params,
             (Promise<void> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_28);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}